

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndTabBar(void)

{
  ImGuiWindow *pIVar1;
  ImGuiTabBar *tab_bar_00;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiPtrOrIndex *ref;
  float fVar4;
  ImGuiTabBar *local_30;
  bool tab_bar_appearing;
  ImGuiTabBar *tab_bar;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->SkipItems & 1U) == 0) {
    tab_bar_00 = GImGui->CurrentTabBar;
    if (tab_bar_00 == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar != __null) && \"Mismatched BeginTabBar()/EndTabBar()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                    ,0x1b52,"void ImGui::EndTabBar()");
    }
    if ((tab_bar_00->WantLayout & 1U) != 0) {
      TabBarLayout(tab_bar_00);
    }
    if ((((tab_bar_00->VisibleTabWasSubmitted & 1U) == 0) && (tab_bar_00->VisibleTabId != 0)) &&
       (pIVar2->FrameCount <= tab_bar_00->PrevFrameVisible + 1)) {
      (pIVar1->DC).CursorPos.y = (tab_bar_00->BarRect).Max.y + tab_bar_00->PrevTabsContentsHeight;
    }
    else {
      fVar4 = ImMax<float>((pIVar1->DC).CursorPos.y - (tab_bar_00->BarRect).Max.y,
                           tab_bar_00->CurrTabsContentsHeight);
      tab_bar_00->CurrTabsContentsHeight = fVar4;
      (pIVar1->DC).CursorPos.y = (tab_bar_00->BarRect).Max.y + tab_bar_00->CurrTabsContentsHeight;
    }
    if ('\x01' < tab_bar_00->BeginCount) {
      (pIVar1->DC).CursorPos = tab_bar_00->BackupCursorPos;
    }
    if ((tab_bar_00->Flags & 0x100000U) == 0) {
      PopID();
    }
    ImVector<ImGuiPtrOrIndex>::pop_back(&pIVar2->CurrentTabBarStack);
    bVar3 = ImVector<ImGuiPtrOrIndex>::empty(&pIVar2->CurrentTabBarStack);
    if (bVar3) {
      local_30 = (ImGuiTabBar *)0x0;
    }
    else {
      ref = ImVector<ImGuiPtrOrIndex>::back(&pIVar2->CurrentTabBarStack);
      local_30 = GetTabBarFromTabBarRef(ref);
    }
    pIVar2->CurrentTabBar = local_30;
  }
  return;
}

Assistant:

void    ImGui::EndTabBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Mismatched BeginTabBar()/EndTabBar()!");
        return;
    }

    // Fallback in case no TabItem have been submitted
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    // Restore the last visible height if no tab is visible, this reduce vertical flicker/movement when a tabs gets removed without calling SetTabItemClosed().
    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    if (tab_bar->VisibleTabWasSubmitted || tab_bar->VisibleTabId == 0 || tab_bar_appearing)
    {
        tab_bar->CurrTabsContentsHeight = ImMax(window->DC.CursorPos.y - tab_bar->BarRect.Max.y, tab_bar->CurrTabsContentsHeight);
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->CurrTabsContentsHeight;
    }
    else
    {
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->PrevTabsContentsHeight;
    }
    if (tab_bar->BeginCount > 1)
        window->DC.CursorPos = tab_bar->BackupCursorPos;

    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        PopID();

    g.CurrentTabBarStack.pop_back();
    g.CurrentTabBar = g.CurrentTabBarStack.empty() ? NULL : GetTabBarFromTabBarRef(g.CurrentTabBarStack.back());
}